

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,Model *model,uint32_t indent,
          bool closing_brace)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *props;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *propNames;
  uint32_t indent_00;
  string *psVar4;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t n_02;
  uint32_t n_03;
  string local_2d8;
  string local_2b8;
  undefined1 local_298 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokset;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [379];
  byte local_1d;
  uint local_1c;
  bool closing_brace_local;
  Model *pMStack_18;
  uint32_t indent_local;
  Model *model_local;
  
  local_1c = (uint)model;
  local_1d = (byte)indent & 1;
  psVar4 = __return_storage_ptr__;
  pMStack_18 = (Model *)this;
  model_local = (Model *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  indent_00 = (uint32_t)psVar4;
  pprint::Indent_abi_cxx11_(&local_1c8,(pprint *)(ulong)local_1c,n);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_1c8);
  to_string_abi_cxx11_(&local_1e8,(tinyusdz *)(ulong)pMStack_18->spec,s);
  ::std::operator<<(poVar2,(string *)&local_1e8);
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  lVar3 = ::std::__cxx11::string::size();
  if (lVar3 != 0) {
    poVar2 = ::std::operator<<(aoStack_198," ");
    ::std::operator<<(poVar2,(string *)&pMStack_18->prim_type_name);
  }
  poVar2 = ::std::operator<<(aoStack_198," \"");
  poVar2 = ::std::operator<<(poVar2,(string *)&pMStack_18->name);
  ::std::operator<<(poVar2,"\"\n");
  bVar1 = PrimMetas::authored(&pMStack_18->meta);
  n_02 = n_00;
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)(ulong)local_1c,n_00);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_208);
    ::std::operator<<(poVar2,"(\n");
    ::std::__cxx11::string::~string((string *)&local_208);
    print_prim_metas_abi_cxx11_
              (&local_228,(tinyusdz *)&pMStack_18->meta,(PrimMeta *)(ulong)(local_1c + 1),indent_00)
    ;
    ::std::operator<<(aoStack_198,(string *)&local_228);
    ::std::__cxx11::string::~string((string *)&local_228);
    pprint::Indent_abi_cxx11_(&local_248,(pprint *)(ulong)local_1c,n_01);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_248);
    ::std::operator<<(poVar2,")\n");
    ::std::__cxx11::string::~string((string *)&local_248);
    n_02 = extraout_EDX;
  }
  pprint::Indent_abi_cxx11_
            ((string *)&tokset._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (pprint *)(ulong)local_1c,n_02);
  poVar2 = ::std::operator<<(aoStack_198,
                             (string *)&tokset._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ::std::operator<<(poVar2,"{\n");
  ::std::__cxx11::string::~string
            ((string *)&tokset._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_298);
  props = &pMStack_18->props;
  propNames = Model::propertyNames(pMStack_18);
  print_props(&local_2b8,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)props,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_298,propNames,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_2b8);
  ::std::__cxx11::string::~string((string *)&local_2b8);
  if ((local_1d & 1) != 0) {
    pprint::Indent_abi_cxx11_(&local_2d8,(pprint *)(ulong)local_1c,n_03);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_2d8);
    ::std::operator<<(poVar2,"}\n");
    ::std::__cxx11::string::~string((string *)&local_2d8);
  }
  ::std::__cxx11::stringstream::str();
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_298);
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Model &model, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(model.spec);
  if (model.prim_type_name.size()) {
    ss << " " << model.prim_type_name;
  }
  ss << " \"" << model.name << "\"\n";

  if (model.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(model.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  std::set<std::string> tokset;
  ss << print_props(model.props, tokset, model.propertyNames(), indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}